

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastDivider2(Gia_Man_t *pNew,int *pNum,int nNum,int *pDiv,int nDiv,int fQuo,
                      Vec_Int_t *vRes)

{
  int iVar1;
  int local_74;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int Temp;
  int Carry_1;
  int Carry;
  int Cntrl;
  int *pQuo;
  int *piStack_40;
  int k;
  int *pRes;
  int local_30;
  int i;
  int fQuo_local;
  int nDiv_local;
  int *pDiv_local;
  int *piStack_18;
  int nNum_local;
  int *pNum_local;
  Gia_Man_t *pNew_local;
  
  local_30 = fQuo;
  i = nDiv;
  _fQuo_local = pDiv;
  pDiv_local._4_4_ = nNum;
  piStack_18 = pNum;
  pNum_local = (int *)pNew;
  piStack_40 = Vec_IntArray(vRes);
  _Carry = (int *)malloc((long)pDiv_local._4_4_ << 2);
  if ((0 < pDiv_local._4_4_) && (0 < i)) {
    iVar1 = Vec_IntSize(vRes);
    if (pDiv_local._4_4_ + i <= iVar1) {
      __assert_fail("Vec_IntSize(vRes) < nNum + nDiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcBlast.c"
                    ,0x180,
                    "void Wlc_BlastDivider2(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)")
      ;
    }
    for (pRes._4_4_ = 0; iVar1 = pDiv_local._4_4_, pRes._4_4_ < pDiv_local._4_4_ + i;
        pRes._4_4_ = pRes._4_4_ + 1) {
      if (pRes._4_4_ < pDiv_local._4_4_) {
        local_64 = piStack_18[pRes._4_4_];
      }
      else {
        local_64 = 0;
      }
      piStack_40[pRes._4_4_] = local_64;
    }
    while (pRes._4_4_ = iVar1 + -1, -1 < pRes._4_4_) {
      if (pRes._4_4_ == pDiv_local._4_4_ + -1) {
        local_68 = 1;
      }
      else {
        local_68 = _Carry[iVar1];
      }
      Carry_1 = local_68;
      Temp = local_68;
      for (pQuo._4_4_ = 0; pQuo._4_4_ <= i; pQuo._4_4_ = pQuo._4_4_ + 1) {
        if (pQuo._4_4_ < i) {
          local_74 = _fQuo_local[pQuo._4_4_];
        }
        else {
          local_74 = 0;
        }
        Wlc_BlastFullAdderSubtr
                  ((Gia_Man_t *)pNum_local,local_74,piStack_40[pRes._4_4_ + pQuo._4_4_],Temp,&Temp,
                   piStack_40 + (pRes._4_4_ + pQuo._4_4_),Carry_1);
      }
      iVar1 = Abc_LitNot(piStack_40[pRes._4_4_ + i]);
      _Carry[pRes._4_4_] = iVar1;
      iVar1 = pRes._4_4_;
    }
    if (local_30 == 0) {
      local_5c = 0;
      for (pQuo._4_4_ = 0; pQuo._4_4_ < i; pQuo._4_4_ = pQuo._4_4_ + 1) {
        Wlc_BlastFullAdder((Gia_Man_t *)pNum_local,_fQuo_local[pQuo._4_4_],piStack_40[pQuo._4_4_],
                           local_5c,&local_5c,&local_60);
        iVar1 = Gia_ManHashMux((Gia_Man_t *)pNum_local,*_Carry,piStack_40[pQuo._4_4_],local_60);
        piStack_40[pQuo._4_4_] = iVar1;
      }
      Vec_IntShrink(vRes,i);
    }
    else {
      Wlc_VecCopy(vRes,_Carry,pDiv_local._4_4_);
    }
    if (_Carry != (int *)0x0) {
      free(_Carry);
    }
    return;
  }
  __assert_fail("nNum > 0 && nDiv > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcBlast.c"
                ,0x17f,
                "void Wlc_BlastDivider2(Gia_Man_t *, int *, int, int *, int, int, Vec_Int_t *)");
}

Assistant:

void Wlc_BlastDivider2( Gia_Man_t * pNew, int * pNum, int nNum, int * pDiv, int nDiv, int fQuo, Vec_Int_t * vRes )
{
    int i, * pRes  = Vec_IntArray(vRes);
    int k, * pQuo  = ABC_ALLOC( int, nNum );
    assert( nNum > 0 && nDiv > 0 );
    assert( Vec_IntSize(vRes) < nNum + nDiv );
    for ( i = 0; i < nNum + nDiv; i++ )
        pRes[i] = i < nNum ? pNum[i] : 0;
    for ( i = nNum-1; i >= 0; i-- )
    {
        int Cntrl = i == nNum-1 ? 1 : pQuo[i+1];
        int Carry = Cntrl;
        for ( k = 0; k <= nDiv; k++ )
            Wlc_BlastFullAdderSubtr( pNew, k < nDiv ? pDiv[k] : 0, pRes[i+k], Carry, &Carry, &pRes[i+k], Cntrl );
        pQuo[i] = Abc_LitNot(pRes[i+nDiv]);
    }
    if ( fQuo )
        Wlc_VecCopy( vRes, pQuo, nNum );
    else
    {
        int Carry = 0, Temp;
        for ( k = 0; k < nDiv; k++ )
        {
            Wlc_BlastFullAdder( pNew, pDiv[k], pRes[k], Carry, &Carry, &Temp );
            pRes[k] = Gia_ManHashMux( pNew, pQuo[0], pRes[k], Temp );
        }
        Vec_IntShrink( vRes, nDiv );
    }
    ABC_FREE( pQuo );
}